

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O3

void __thiscall Sealer::Sealer(Sealer *this)

{
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  this->trans_count = 0;
  (this->merkle_root)._M_dataplus._M_p = (pointer)&(this->merkle_root).field_2;
  (this->merkle_root)._M_string_length = 0;
  (this->merkle_root).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->merkle_root,0,(char *)0x0,0x109294);
  return;
}

Assistant:

Sealer::Sealer() {
    merkle_root = "";
}